

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraint.cpp
# Opt level: O1

void __thiscall chrono::ChConstraint::ArchiveIN(ChConstraint *this,ChArchiveIn *marchive)

{
  eChConstraintMode_mapper typemapper;
  eChConstraintMode_mapper local_80;
  ChEnumMapper<chrono::eChConstraintMode> local_60;
  char *local_40;
  ChEnumMapper<chrono::eChConstraintMode> *local_38;
  undefined1 local_30;
  
  ChArchiveIn::VersionRead<chrono::ChConstraint>(marchive);
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.value_ptr =
       (eChConstraintMode *)&this->cfm_i;
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9fd977;
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_80);
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.value_ptr =
       (eChConstraintMode *)&this->valid;
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x97f3aa;
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_80);
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.value_ptr =
       (eChConstraintMode *)&this->disabled;
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x98f6e7;
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_80);
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.value_ptr =
       (eChConstraintMode *)&this->redundant;
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9fd97d;
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_80);
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.value_ptr =
       (eChConstraintMode *)&this->broken;
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x98f6f0;
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_80);
  eChConstraintMode_mapper::eChConstraintMode_mapper(&local_80);
  eChConstraintMode_mapper::operator()(&local_60,&local_80,&this->mode);
  local_40 = "mode";
  local_30 = 0;
  local_38 = &local_60;
  (**(code **)(*(long *)marchive + 0x58))(marchive);
  local_60.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b62b08
  ;
  if (local_60.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_80.super_ChEnumMapper<chrono::eChConstraintMode>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b62b08;
  if (local_80.super_ChEnumMapper<chrono::eChConstraintMode>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super_ChEnumMapper<chrono::eChConstraintMode>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::eChConstraintMode>,_std::allocator<chrono::ChEnumNamePair<chrono::eChConstraintMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChConstraint::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChConstraint>();

    // stream in all member data:
    marchive >> CHNVP(cfm_i);
    marchive >> CHNVP(valid);
    marchive >> CHNVP(disabled);
    marchive >> CHNVP(redundant);
    marchive >> CHNVP(broken);
    eChConstraintMode_mapper typemapper;
    marchive >> CHNVP(typemapper(this->mode), "mode");
}